

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path-util.cc
# Opt level: O1

bool tinyusdz::pathutil::ValidatePrimPath(Path *path,string *err)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  string *name;
  bool bVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_names;
  long *local_98 [2];
  long local_88 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (path->_valid == false) {
    if (err == (string *)0x0) {
      return false;
    }
    pcVar4 = (char *)err->_M_string_length;
    pcVar3 = "Path is invalid.";
  }
  else {
    if (((path->_prop_part)._M_string_length == 0) && ((path->_prim_part)._M_string_length != 0)) {
      local_98[0] = local_88;
      local_58 = err;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"/","");
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar5 = 0x147ae15;
      uVar2 = 0;
      do {
        uVar2 = ::std::__cxx11::string::find_first_not_of((char *)path,(ulong)local_98[0],uVar2);
        if (uVar2 == 0xffffffffffffffff) break;
        uVar2 = ::std::__cxx11::string::find((char *)path,(ulong)local_98[0],uVar2);
        ::std::__cxx11::string::substr((ulong)&local_50,(ulong)path);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   &local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
      bVar6 = local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      if (!bVar6) {
        bVar1 = ValidatePrimElementName
                          (local_78.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        if (bVar1) {
          lVar5 = 0x20;
          uVar2 = 0;
          do {
            uVar2 = uVar2 + 1;
            bVar6 = (ulong)((long)local_78.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_78.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar2;
            if (bVar6) goto LAB_001f8f90;
            name = (string *)
                   ((long)&((local_78.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5);
            lVar5 = lVar5 + 0x20;
            bVar1 = ValidatePrimElementName(name);
          } while (bVar1);
        }
        if (local_58 != (string *)0x0) {
          ::std::__cxx11::string::_M_replace
                    ((ulong)local_58,0,(char *)local_58->_M_string_length,0x3f75de);
        }
      }
LAB_001f8f90:
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      return bVar6;
    }
    if (err == (string *)0x0) {
      return false;
    }
    pcVar4 = (char *)err->_M_string_length;
    pcVar3 = "Path is not Prim path.";
  }
  ::std::__cxx11::string::_M_replace((ulong)err,0,pcVar4,(ulong)pcVar3);
  return false;
}

Assistant:

bool ValidatePrimPath(const Path &path, std::string *err) {
  if (!path.is_valid()) {
    if (err) {
      (*err) = "Path is invalid.";
    }
    return false;
  }

  if (!path.is_prim_path()) {
    if (err) {
      (*err) = "Path is not Prim path.";
    }
    return false;
  }

  const std::vector<std::string> element_names = split(path.prim_part(), "/");

  for (size_t i = 0; i < element_names.size(); i++) {
    if (!ValidatePrimElementName(element_names[i])) {
      if (err) {
        (*err) = "Prim path is not composed of valid identifiers.";
      }
      
      return false;
    }
  }

  return true;
}